

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_25095d::MemberExpr::printLeft(MemberExpr *this,OutputStream *S)

{
  Node::print(this->LHS,S);
  OutputStream::operator+=(S,this->Kind);
  Node::print(this->RHS,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    LHS->print(S);
    S += Kind;
    RHS->print(S);
  }